

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O1

int stbrp__skyline_find_min_y(stbrp_context *c,stbrp_node *first,int x0,int width,int *pwaste)

{
  int iVar1;
  int iVar2;
  undefined4 in_register_0000000c;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  iVar4 = (int)first;
  if (iVar4 < c->width) {
    __assert_fail("first->x <= x0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imstb_rectpack.h"
                  ,299,
                  "int stbrp__skyline_find_min_y(stbrp_context *, stbrp_node *, int, int, int *)");
  }
  if (iVar4 < **(int **)&c->align) {
    iVar7 = c->width;
    iVar2 = 0;
    iVar5 = 0;
    if (iVar7 < x0 + iVar4) {
      iVar5 = 0;
      iVar6 = 0;
      iVar2 = 0;
      do {
        iVar1 = c->height;
        if (iVar1 - iVar2 == 0 || iVar1 < iVar2) {
          iVar3 = **(int **)&c->align - iVar7;
          iVar7 = x0 - iVar6;
          if (iVar3 + iVar6 <= x0) {
            iVar7 = iVar3;
          }
          iVar3 = (iVar2 - iVar1) * iVar7;
        }
        else {
          iVar3 = (iVar1 - iVar2) * iVar6;
          iVar2 = iVar1;
          if (iVar7 < iVar4) {
            iVar7 = **(int **)&c->align - iVar4;
          }
          else {
            iVar7 = **(int **)&c->align - iVar7;
          }
        }
        iVar5 = iVar5 + iVar3;
        iVar6 = iVar6 + iVar7;
        c = *(stbrp_context **)&c->align;
        iVar7 = c->width;
      } while (iVar7 < x0 + iVar4);
    }
    *(int *)CONCAT44(in_register_0000000c,width) = iVar5;
    return iVar2;
  }
  __assert_fail("node->next->x > x0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imstb_rectpack.h"
                ,0x132,
                "int stbrp__skyline_find_min_y(stbrp_context *, stbrp_node *, int, int, int *)");
}

Assistant:

static int stbrp__skyline_find_min_y(stbrp_context *c, stbrp_node *first, int x0, int width, int *pwaste)
{
   stbrp_node *node = first;
   int x1 = x0 + width;
   int min_y, visited_width, waste_area;

   STBRP__NOTUSED(c);

   STBRP_ASSERT(first->x <= x0);

   #if 0
   // skip in case we're past the node
   while (node->next->x <= x0)
      ++node;
   #else
   STBRP_ASSERT(node->next->x > x0); // we ended up handling this in the caller for efficiency
   #endif

   STBRP_ASSERT(node->x <= x0);

   min_y = 0;
   waste_area = 0;
   visited_width = 0;
   while (node->x < x1) {
      if (node->y > min_y) {
         // raise min_y higher.
         // we've accounted for all waste up to min_y,
         // but we'll now add more waste for everything we've visted
         waste_area += visited_width * (node->y - min_y);
         min_y = node->y;
         // the first time through, visited_width might be reduced
         if (node->x < x0)
            visited_width += node->next->x - x0;
         else
            visited_width += node->next->x - node->x;
      } else {
         // add waste area
         int under_width = node->next->x - node->x;
         if (under_width + visited_width > width)
            under_width = width - visited_width;
         waste_area += under_width * (min_y - node->y);
         visited_width += under_width;
      }
      node = node->next;
   }

   *pwaste = waste_area;
   return min_y;
}